

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void take_line_escaped_newline(Env *env)

{
  _Bool _Var1;
  uint uVar2;
  
LAB_0010a02c:
  do {
    _Var1 = (*env->lexer->eof)(env->lexer);
    if ((!_Var1) &&
       (((uVar2 = env->lexer->lookahead, 0xd < uVar2 || ((0x3400U >> (uVar2 & 0x1f) & 1) == 0)) &&
        (uVar2 != 0x5c)))) {
LAB_0010a04a:
      advance(env);
      goto LAB_0010a02c;
    }
    if (env->lexer->lookahead != 0x5c) {
      return;
    }
    advance(env);
    uVar2 = env->lexer->lookahead;
    if ((uVar2 != 0x20) && (uVar2 != 9)) goto LAB_0010a04a;
    while (uVar2 < 0x21) {
      if ((0x100000200U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((0x3400UL >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_0010a04a;
        break;
      }
      advance(env);
      uVar2 = env->lexer->lookahead;
    }
  } while( true );
}

Assistant:

static void take_line_escaped_newline(Env *env) {
  for (;;) {
    while (not_eof(env) && !is_newline(PEEK) && PEEK != '\\') S_ADVANCE;
    if (PEEK == '\\') {
      S_ADVANCE;
      if (is_space_or_tab(PEEK)) {
        while (is_space_or_tab(PEEK)) S_ADVANCE;
        if (is_newline(PEEK)) S_ADVANCE;
      }
      else S_ADVANCE;
    }
    else return;
  }
}